

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void flatcc_json_printer_union_struct
               (flatcc_json_printer_t *ctx,flatcc_json_printer_union_descriptor_t *ud,
               flatcc_json_printer_struct_f *pf)

{
  char *pcVar1;
  void *pvVar2;
  flatcc_json_printer_struct_f *pf_local;
  flatcc_json_printer_union_descriptor_t *ud_local;
  flatcc_json_printer_t *ctx_local;
  
  ctx->level = ctx->level + 1;
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + 1;
  *pcVar1 = '{';
  pvVar2 = read_uoffset_ptr(ud->member);
  (*pf)(ctx,pvVar2);
  if (ctx->indent != '\0') {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '\n';
    ctx->level = ctx->level + -1;
    print_indent(ctx);
  }
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + 1;
  *pcVar1 = '}';
  return;
}

Assistant:

void flatcc_json_printer_union_struct(flatcc_json_printer_t *ctx,
        flatcc_json_printer_union_descriptor_t *ud,
        flatcc_json_printer_struct_f pf)
{
    print_start('{');
    pf(ctx, read_uoffset_ptr(ud->member));
    print_end('}');
}